

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorOutputStream.hpp
# Opt level: O0

ssize_t __thiscall
binlog::detail::RecoverableVectorOutputStream::write
          (RecoverableVectorOutputStream *this,int __fd,void *__buf,size_t __n)

{
  RecoverableVectorOutputStream *this_00;
  size_type sVar1;
  undefined4 in_register_00000034;
  char *__last;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  const_iterator in_stack_00000008;
  uint64_t magic;
  undefined8 local_20;
  RecoverableVectorOutputStream *__first;
  
  __last = (char *)CONCAT44(in_register_00000034,__fd);
  local_20 = 0;
  __first = this;
  this_00 = (RecoverableVectorOutputStream *)
            std::vector<char,_std::allocator<char>_>::capacity(&this->_vector);
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->_vector);
  if (this_00 < (RecoverableVectorOutputStream *)(sVar1 + (long)__buf)) {
    local_20 = clearMagic(this_00);
  }
  std::vector<char,_std::allocator<char>_>::end(&this->_vector);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)this_00,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)this);
  std::vector<char,std::allocator<char>>::insert<char_const*,void>
            (unaff_retaddr,in_stack_00000008,(char *)__first,__last);
  if (local_20 != 0) {
    setMagic(this_00,(uint64_t)this);
  }
  updateSize(this_00);
  return (ssize_t)this;
}

Assistant:

RecoverableVectorOutputStream& write(const char* buffer, std::streamsize size)
  {
    std::uint64_t magic = 0;
    if (_vector.capacity() < _vector.size() + std::size_t(size))
    {
      // vector will reallocate, clear the magic of the old buffer
      // to avoid recovering invalid data
      magic = clearMagic();
    }

    _vector.insert(_vector.end(), buffer, buffer + size);
    if (magic != 0) { setMagic(magic); }
    updateSize();
    return *this;
  }